

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnExport
          (BinaryReaderIR *this,Index index,ExternalKind kind,Index item_index,string_view name)

{
  Export *this_00;
  char *pcVar1;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aVar2;
  ExportModuleField *pEVar3;
  Location loc;
  Location loc_1;
  ExportModuleField *local_c0;
  ExternalKind local_b4;
  _Head_base<0UL,_wabt::ExportModuleField_*,_false> local_b0;
  string_view local_a8;
  Var local_98;
  Location local_50;
  
  local_a8.size_ = name.size_;
  local_a8.data_ = name.data_;
  pcVar1 = this->filename_;
  aVar2.offset = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_98.loc.field_1.field_0.last_column = 0;
  local_b4 = kind;
  local_98.loc.filename.size_ = strlen(pcVar1);
  local_98.loc.filename.data_ = pcVar1;
  local_98.loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)aVar2.offset;
  MakeUnique<wabt::ExportModuleField,wabt::Location>((wabt *)&local_c0,&local_98.loc);
  pEVar3 = local_c0;
  this_00 = &local_c0->export_;
  string_view::to_string_abi_cxx11_((string *)&local_98,&local_a8);
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_98);
  if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_98.loc.filename.data_ !=
      &local_98.loc.field_1) {
    operator_delete(local_98.loc.filename.data_);
  }
  pcVar1 = this->filename_;
  aVar2.offset = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_50.field_1.field_0.last_column = 0;
  local_50.filename.size_ = strlen(pcVar1);
  local_50.filename.data_ = pcVar1;
  local_50.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)aVar2.offset;
  Var::Var(&local_98,item_index,&local_50);
  Var::operator=(&(pEVar3->export_).var,&local_98);
  Var::~Var(&local_98);
  (pEVar3->export_).kind = local_b4;
  local_b0._M_head_impl = local_c0;
  local_c0 = (ExportModuleField *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
                       *)&local_b0);
  if (local_b0._M_head_impl != (ExportModuleField *)0x0) {
    (*((local_b0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  local_b0._M_head_impl = (ExportModuleField *)0x0;
  if (local_c0 != (ExportModuleField *)0x0) {
    (**(code **)(*(long *)local_c0 + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnExport(Index index,
                                ExternalKind kind,
                                Index item_index,
                                string_view name) {
  auto field = MakeUnique<ExportModuleField>(GetLocation());
  Export& export_ = field->export_;
  export_.name = name.to_string();
  export_.var = Var(item_index, GetLocation());
  export_.kind = kind;
  module_->AppendField(std::move(field));
  return Result::Ok;
}